

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void __thiscall
Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
~ArenaAllocatorBase(ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL> *this_local;
  
  if (((this->super_ArenaData).lockBlockList & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                       ,0x45,"(!lockBlockList)","!lockBlockList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  ArenaMemoryTracking::ReportFreeAll(&this->super_Allocator);
  ArenaMemoryTracking::ArenaDestroyed(&this->super_Allocator);
  bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::IsClosed((this->super_ArenaData).pageAllocator);
  if (!bVar2) {
    ReleasePageMemory(this);
  }
  ReleaseHeapMemory(this);
  InlineCacheFreeListPolicy::Release(this->freeList);
  LogEnd(this);
  return;
}

Assistant:

ArenaAllocatorBase<TFreeListPolicy, ObjectAlignmentBitShiftArg, RequireObjectAlignment, MaxObjectSize>::
~ArenaAllocatorBase()
{
    Assert(!lockBlockList);
    ArenaMemoryTracking::ReportFreeAll(this);
    ArenaMemoryTracking::ArenaDestroyed(this);

    if (!pageAllocator->IsClosed())
    {
        ReleasePageMemory();
    }
    ReleaseHeapMemory();
    TFreeListPolicy::Release(this->freeList);
#ifdef PROFILE_MEM
    LogEnd();
#endif

}